

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acutest.h
# Opt level: O1

void acutest_abort_(void)

{
  if (acutest_abort_has_jmp_buf_ == '\x01') {
    longjmp((__jmp_buf_tag *)acutest_abort_jmp_buf_,1);
  }
  fflush(_stdout);
  fflush(_stderr);
  acutest_exit_(1);
}

Assistant:

void
acutest_abort_(void)
{
    if(acutest_abort_has_jmp_buf_) {
        longjmp(acutest_abort_jmp_buf_, 1);
    } else {
        if(acutest_current_test_ != NULL)
            acutest_fini_(acutest_current_test_->name);
        fflush(stdout);
        fflush(stderr);
        acutest_exit_(ACUTEST_STATE_FAILED);
    }
}